

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O0

Real Omega_h::get_expected_nelems(Mesh *mesh,Reals *v2m)

{
  Int dim;
  Real RVar1;
  Read<double> local_30;
  Real local_20;
  Real complexity;
  Reals *v2m_local;
  Mesh *mesh_local;
  
  complexity = (Real)v2m;
  v2m_local = (Reals *)mesh;
  Read<double>::Read(&local_30,v2m);
  RVar1 = get_complexity(mesh,&local_30);
  Read<double>::~Read(&local_30);
  local_20 = RVar1;
  dim = Mesh::dim((Mesh *)v2m_local);
  RVar1 = get_expected_nelems_from_complexity(RVar1,dim);
  return RVar1;
}

Assistant:

Real get_expected_nelems(Mesh* mesh, Reals v2m) {
  auto complexity = get_complexity(mesh, v2m);
  return get_expected_nelems_from_complexity(complexity, mesh->dim());
}